

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ArrayLengthFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  long lVar2;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffb8c;
  FunctionNullHandling in_stack_fffffffffffffb98;
  allocator_type local_461;
  bind_lambda_function_t in_stack_fffffffffffffba0;
  LogicalType local_448 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_400;
  LogicalType local_3e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d0;
  _Any_data local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  _Any_data local_398;
  undefined8 local_388;
  undefined8 uStack_380;
  LogicalType local_378;
  LogicalType local_360;
  string local_348;
  ScalarFunction local_328;
  ScalarFunction local_200;
  BaseScalarFunction local_d8;
  
  ::std::__cxx11::string::string((string *)&local_348,"array_length",(allocator *)local_448);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_348);
  ::std::__cxx11::string::~string((string *)&local_348);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffba0,ANY);
  LogicalType::LIST(local_448,(LogicalType *)&stack0xfffffffffffffba0);
  __l._M_len = 1;
  __l._M_array = local_448;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3d0,__l,&local_461);
  LogicalType::LogicalType(&local_3e8,BIGINT);
  local_388 = 0;
  uStack_380 = 0;
  local_398._M_unused._M_object = (void *)0x0;
  local_398._8_8_ = 0;
  LogicalType::LogicalType(&local_360,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_360;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffb84;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffb8c;
  ScalarFunction::ScalarFunction
            (&local_200,(vector<duckdb::LogicalType,_true> *)&local_3d0,&local_3e8,
             (scalar_function_t *)&local_398,ArrayOrListLengthBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffb98,in_stack_fffffffffffffba0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_200);
  ScalarFunction::~ScalarFunction(&local_200);
  LogicalType::~LogicalType(&local_360);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_398);
  LogicalType::~LogicalType(&local_3e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d0);
  LogicalType::~LogicalType(local_448);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffba0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffba0,ANY);
  LogicalType::LIST(local_448,(LogicalType *)&stack0xfffffffffffffba0);
  LogicalType::LogicalType(local_448 + 1,BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = local_448;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_400,__l_00,&local_461);
  LogicalType::LogicalType(local_448 + 2,BIGINT);
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  LogicalType::LogicalType(&local_378,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_378;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffb84;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffb8c;
  ScalarFunction::ScalarFunction
            (&local_328,(vector<duckdb::LogicalType,_true> *)&local_400,local_448 + 2,
             (scalar_function_t *)&local_3b8,ArrayOrListLengthBinaryBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffffb98,in_stack_fffffffffffffba0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_328);
  ScalarFunction::~ScalarFunction(&local_328);
  LogicalType::~LogicalType(&local_378);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  LogicalType::~LogicalType(local_448 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_400);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_448[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffba0);
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start; function != pSVar1;
      function = function + 1) {
    BaseScalarFunction::SetReturnsError(&local_d8,&function->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_d8);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet ArrayLengthFun::GetFunctions() {
	ScalarFunctionSet array_length("array_length");
	array_length.AddFunction(
	    ScalarFunction({LogicalType::LIST(LogicalType::ANY)}, LogicalType::BIGINT, nullptr, ArrayOrListLengthBind));
	array_length.AddFunction(ScalarFunction({LogicalType::LIST(LogicalType::ANY), LogicalType::BIGINT},
	                                        LogicalType::BIGINT, nullptr, ArrayOrListLengthBinaryBind));
	for (auto &func : array_length.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return (array_length);
}